

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1067:7)>
::getImpl(SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1067:7)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> depResult;
  ExceptionOr<kj::_::Void> local_390;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_1f0;
  
  local_1f0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1f0.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_1f0.super_ExceptionOrValue);
  if (local_1f0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_390,
               &local_1f0.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_390.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  else {
    if (local_1f0.value.ptr.isSet != true) goto LAB_001da502;
    anon_class_8_1_bc11688f_for_func::operator()(&this->func,&local_1f0.value.ptr.field_1.value);
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_390);
LAB_001da502:
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::
  ~ExceptionOr(&local_1f0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }